

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-a64.c
# Opt level: O1

void disas_fp_int_conv(DisasContext_conflict1 *s,uint32_t insn)

{
  uint type;
  uint uVar1;
  uint rn;
  uint64_t pc;
  uint32_t target_el;
  uint rmode;
  uint rd;
  _Bool _Var2;
  
  if ((insn >> 0x1d & 1) != 0) goto LAB_006a65e8;
  rd = insn & 0x1f;
  rn = insn >> 5 & 0x1f;
  uVar1 = insn >> 0x10 & 7;
  rmode = insn >> 0x13 & 3;
  type = insn >> 0x16 & 3;
  if (uVar1 < 6) {
    _Var2 = false;
    if ((((3U >> uVar1 & 1) == 0) && (_Var2 = (0xcU >> uVar1 & 1) != 0, rmode != 0)) ||
       ((1 < type && ((type == 2 || ((s->isar->id_aa64pfr0 & 0xf0000) != 0x10000))))))
    goto LAB_006a65e8;
    if (s->fp_access_checked == true) goto LAB_006a65f4;
    s->fp_access_checked = true;
    target_el = s->fp_excp_el;
    if (target_el == 0) {
      handle_fpfpcvt(s,rd,rn,uVar1,_Var2,rmode,0x40,insn >> 0x1f,type);
      return;
    }
    pc = s->pc_curr;
    goto LAB_006a6598;
  }
  uVar1 = (type << 5 | insn >> 0x18 & 0xffffff80) + rmode * 8 | uVar1;
  if (uVar1 < 0xa6) {
    if (1 < uVar1 - 6) {
      if (1 < uVar1 - 0x66) {
        if ((uVar1 == 0x3e) && ((s->isar->id_aa64isar1 & 0xf000) != 0)) {
          _Var2 = fp_access_check(s);
          if (!_Var2) {
            return;
          }
          handle_fjcvtzs(s,rd,rn);
          return;
        }
        goto LAB_006a65e8;
      }
      goto LAB_006a654f;
    }
  }
  else if ((1 < uVar1 - 0xa6) && (1 < uVar1 - 0xce)) {
    if (1 < uVar1 - 0xe6) goto LAB_006a65e8;
LAB_006a654f:
    if ((s->isar->id_aa64pfr0 & 0xf0000) != 0x10000) {
LAB_006a65e8:
      unallocated_encoding_aarch64(s);
      return;
    }
  }
  if (s->fp_access_checked == true) {
LAB_006a65f4:
    __assert_fail("!s->fp_access_checked",
                  "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/translate-a64.c"
                  ,0x487,"_Bool fp_access_check(DisasContext *)");
  }
  s->fp_access_checked = true;
  target_el = s->fp_excp_el;
  if (target_el == 0) {
    handle_fmov(s,rd,rn,type,(_Bool)((byte)(insn >> 0x10) & 1));
    return;
  }
  pc = s->pc_curr;
LAB_006a6598:
  gen_exception_insn(s,pc,1,0x1fe0000a,target_el);
  return;
}

Assistant:

static void disas_fp_int_conv(DisasContext *s, uint32_t insn)
{
    int rd = extract32(insn, 0, 5);
    int rn = extract32(insn, 5, 5);
    int opcode = extract32(insn, 16, 3);
    int rmode = extract32(insn, 19, 2);
    int type = extract32(insn, 22, 2);
    bool sbit = extract32(insn, 29, 1);
    bool sf = extract32(insn, 31, 1);
    bool itof = false;

    if (sbit) {
        goto do_unallocated;
    }

    switch (opcode) {
    case 2: /* SCVTF */
    case 3: /* UCVTF */
        itof = true;
        /* fallthru */
    case 4: /* FCVTAS */
    case 5: /* FCVTAU */
        if (rmode != 0) {
            goto do_unallocated;
        }
        /* fallthru */
    case 0: /* FCVT[NPMZ]S */
    case 1: /* FCVT[NPMZ]U */
        switch (type) {
        case 0: /* float32 */
        case 1: /* float64 */
            break;
        case 3: /* float16 */
            if (!dc_isar_feature(aa64_fp16, s)) {
                goto do_unallocated;
            }
            break;
        default:
            goto do_unallocated;
        }
        if (!fp_access_check(s)) {
            return;
        }
        handle_fpfpcvt(s, rd, rn, opcode, itof, rmode, 64, sf, type);
        break;

    default:
        switch (sf << 7 | type << 5 | rmode << 3 | opcode) {
        case 0x66: // 0b01100110: /* FMOV half <-> 32-bit int */
        case 0x67: // 0b01100111:
        case 0xe6: // 0b11100110: /* FMOV half <-> 64-bit int */
        case 0xe7: // 0b11100111:
            if (!dc_isar_feature(aa64_fp16, s)) {
                goto do_unallocated;
            }
            /* fallthru */
        case 6: // 0b00000110: /* FMOV 32-bit */
        case 7: // 0b00000111:
        case 0xa6: // 0b10100110: /* FMOV 64-bit */
        case 0xa7: // 0b10100111:
        case 0xce: // 0b11001110: /* FMOV top half of 128-bit */
        case 0xcf: // 0b11001111:
            if (!fp_access_check(s)) {
                return;
            }
            itof = opcode & 1;
            handle_fmov(s, rd, rn, type, itof);
            break;

        case 0x3e: // 0b00111110: /* FJCVTZS */
            if (!dc_isar_feature(aa64_jscvt, s)) {
                goto do_unallocated;
            } else if (fp_access_check(s)) {
                handle_fjcvtzs(s, rd, rn);
            }
            break;

        default:
        do_unallocated:
            unallocated_encoding(s);
            return;
        }
        break;
    }
}